

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_TestShell::
createTest(TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_TestShell
           *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockHierarchyTest.cpp"
                                  ,0x81);
  this_00->_vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_002bc7d0;
  return this_00;
}

Assistant:

TEST(MockHierarchyTest, checkExpectationsWorksHierarchicallyForLastCallNotFinished)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("first::foobar")->withParameter("boo", 1);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "first::foobar", expectations, expectations);

    mock("first").expectOneCall("foobar").withParameter("boo", 1);
    mock("first").actualCall("foobar");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}